

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

void __thiscall
CommandDrawImage::Draw(CommandDrawImage *this,SBarInfoMainBlock *block,DSBarInfo *statusBar)

{
  ulong uVar1;
  ulong uVar2;
  FTexture *texture;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  if ((this->flags & 0x80) != 0) {
    SBarInfoCommandFlowControl::Draw(&this->super_SBarInfoCommandFlowControl,block,statusBar);
  }
  texture = this->texture;
  if (texture != (FTexture *)0x0) {
    if ((this->flags & 0x20) == 0) {
      if (this->applyscale == true) {
        uVar1._0_2_ = texture->Width;
        uVar1._2_2_ = texture->Height;
        uVar1._4_2_ = texture->WidthMask;
        uVar1._6_2_ = *(undefined2 *)&texture->field_0x3e;
        auVar3._8_4_ = 0;
        auVar3._0_8_ = uVar1;
        auVar3._12_2_ = uVar1._6_2_;
        auVar5._8_2_ = uVar1._4_2_;
        auVar5._0_8_ = uVar1;
        auVar5._10_4_ = auVar3._10_4_;
        auVar7._6_8_ = 0;
        auVar7._0_6_ = auVar5._8_6_;
        auVar9._0_8_ = (double)(ushort)(undefined2)uVar1;
        auVar9._8_8_ = (double)(int)CONCAT82(SUB148(auVar7 << 0x40,6),uVar1._2_2_);
        divpd(auVar9,(undefined1  [16])texture->Scale);
      }
    }
    else {
      uVar2._0_2_ = texture->Width;
      uVar2._2_2_ = texture->Height;
      uVar2._4_2_ = texture->WidthMask;
      uVar2._6_2_ = *(undefined2 *)&texture->field_0x3e;
      auVar4._8_4_ = 0;
      auVar4._0_8_ = uVar2;
      auVar4._12_2_ = uVar2._6_2_;
      auVar6._8_2_ = uVar2._4_2_;
      auVar6._0_8_ = uVar2;
      auVar6._10_4_ = auVar4._10_4_;
      auVar8._6_8_ = 0;
      auVar8._0_6_ = auVar6._8_6_;
      auVar10._0_8_ = (double)(ushort)(undefined2)uVar2;
      auVar10._8_8_ = (double)(int)CONCAT82(SUB148(auVar8 << 0x40,6),uVar2._2_2_);
      divpd(auVar10,(undefined1  [16])texture->Scale);
    }
    DSBarInfo::DrawGraphic
              (statusBar,texture,this->imgx,this->imgy,block->xOffset,block->yOffset,
               block->currentAlpha * this->alpha,block->fullScreenOffsets,
               (bool)(this->super_SBarInfoCommandFlowControl).field_0x31,false,this->offset);
  }
  return;
}

Assistant:

void	Draw(const SBarInfoMainBlock *block, const DSBarInfo *statusBar)
		{
			if(flags & DI_ALTERNATEONFAIL)
				SBarInfoCommandFlowControl::Draw(block, statusBar);

			if(texture == NULL)
				return;

			int w = maxwidth, h = maxheight;
			
			// We must calculate this per frame in order to prevent glitches with cl_capfps true.
			double frameAlpha = block->Alpha() * alpha;
			
			if(flags & DI_DRAWINBOX)
			{
				double scale1, scale2;
				scale1 = scale2 = 1.0f;
				double texwidth = (int) (texture->GetScaledWidthDouble()*spawnScaleX);
				double texheight = (int) (texture->GetScaledHeightDouble()*spawnScaleY);
				
				if (w != -1 && (w<texwidth || (flags & DI_FORCESCALE)))
				{
					scale1 = w/texwidth;
				}
				if (h != -1 && (h<texheight || (flags & DI_FORCESCALE)))
				{
					scale2 = h/texheight;
				}
				
				if (flags & DI_FORCESCALE)
				{
					if (w == -1 || (h != -1 && scale2<scale1))
						scale1=scale2;
				}
				else if (scale2<scale1) scale1=scale2;
				
				w=(int)(texwidth*scale1);
				h=(int)(texheight*scale1);
			}
			else if (applyscale)
			{
				w=(int) (texture->GetScaledWidthDouble()*spawnScaleX);
				h=(int) (texture->GetScaledHeightDouble()*spawnScaleY);
			}
			statusBar->DrawGraphic(texture, imgx, imgy, block->XOffset(), block->YOffset(), frameAlpha, block->FullScreenOffsets(),
				translatable, false, offset, false, w, h);
		}